

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_p_race_values(parser *p)

{
  errr eVar1;
  void *pvVar2;
  char *pcVar3;
  parser_error pVar4;
  wchar_t index;
  wchar_t value;
  int local_40;
  int local_3c;
  char *local_38;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar4 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"values");
    local_38 = string_make(pcVar3);
    pcVar3 = strtok(local_38," |");
    if (pcVar3 == (char *)0x0) {
      pVar4 = PARSE_ERROR_NONE;
    }
    else {
      do {
        local_3c = 0;
        local_40 = 0;
        eVar1 = grab_index_and_int(&local_3c,&local_40,list_element_names,"RES_",pcVar3);
        if (eVar1 != 0) {
          pVar4 = PARSE_ERROR_INVALID_VALUE;
          break;
        }
        *(undefined2 *)((long)pvVar2 + (long)local_40 * 4 + 0x88) = (undefined2)local_3c;
        pVar4 = PARSE_ERROR_NONE;
        pcVar3 = strtok((char *)0x0," |");
      } while (pcVar3 != (char *)0x0);
    }
    string_free(local_38);
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_p_race_values(struct parser *p) {
	struct player_race *r = parser_priv(p);
	char *s;
	char *t;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_index_and_int(&value, &index, list_element_names, "RES_", t)) {
			found = true;
			r->el_info[index].res_level = value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}